

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode
UA_SecureChannelManager_open
          (UA_SecureChannelManager *cm,UA_Connection *conn,UA_OpenSecureChannelRequest *request,
          UA_OpenSecureChannelResponse *response)

{
  UA_ByteString *src;
  UA_UInt32 UVar1;
  uint uVar2;
  channel_list_entry *pcVar3;
  undefined8 uVar4;
  UA_DateTime UVar5;
  uint uVar6;
  UA_StatusCode UVar7;
  channel_list_entry *pcVar8;
  UA_Byte *pUVar9;
  UA_String UVar10;
  undefined1 local_50 [8];
  timeval tv;
  
  UVar7 = 0x80540000;
  if (request->securityMode == UA_MESSAGESECURITYMODE_NONE) {
    if (cm->currentChannelCount < (uint)(cm->server->config).maxSecureChannels) {
LAB_0011c2ad:
      pcVar8 = (channel_list_entry *)malloc(0xe8);
      if (pcVar8 == (channel_list_entry *)0x0) {
        UVar7 = 0x80030000;
      }
      else {
        memset(pcVar8,0,0xd8);
        UVar1 = cm->lastChannelId;
        cm->lastChannelId = UVar1 + 1;
        tv.tv_usec = (__suseconds_t)&(pcVar8->channel).securityToken;
        (pcVar8->channel).securityToken.channelId = UVar1;
        UVar1 = cm->lastTokenId;
        cm->lastTokenId = UVar1 + 1;
        (pcVar8->channel).securityToken.tokenId = UVar1;
        gettimeofday((timeval *)local_50,(__timezone_ptr_t)0x0);
        (pcVar8->channel).securityToken.createdAt =
             (long)local_50 * 10000000 + tv.tv_sec * 10 + 0x19db1ded53e8000;
        uVar2 = (cm->server->config).maxSecurityTokenLifetime;
        uVar6 = request->requestedLifetime;
        if (uVar2 <= request->requestedLifetime) {
          uVar6 = uVar2;
        }
        if (uVar6 == 0) {
          uVar6 = uVar2;
        }
        (pcVar8->channel).securityToken.revisedLifetime = uVar6;
        UA_copy(&request->clientNonce,&(pcVar8->channel).clientNonce,UA_TYPES + 0xe);
        UVar10 = UA_String_fromChars("http://opcfoundation.org/UA/SecurityPolicy#None");
        (pcVar8->channel).serverAsymAlgSettings.securityPolicyUri.length = UVar10.length;
        (pcVar8->channel).serverAsymAlgSettings.securityPolicyUri.data = UVar10.data;
        src = &(pcVar8->channel).serverNonce;
        pUVar9 = (UA_Byte *)malloc(1);
        (pcVar8->channel).serverNonce.data = pUVar9;
        if (pUVar9 != (UA_Byte *)0x0) {
          src->length = 1;
          *pUVar9 = 'a';
        }
        UA_copy(src,&response->serverNonce,UA_TYPES + 0xe);
        uVar4 = *(undefined8 *)tv.tv_usec;
        UVar5 = *(UA_DateTime *)(tv.tv_usec + 8);
        (response->securityToken).channelId = (int)uVar4;
        (response->securityToken).tokenId = (int)((ulong)uVar4 >> 0x20);
        (response->securityToken).createdAt = UVar5;
        *(undefined8 *)&(response->securityToken).revisedLifetime =
             *(undefined8 *)(tv.tv_usec + 0x10);
        gettimeofday((timeval *)local_50,(__timezone_ptr_t)0x0);
        (response->responseHeader).timestamp =
             (long)local_50 * 10000000 + 0x19db1ded53e8000 + tv.tv_sec * 10;
        clock_gettime(4,(timespec *)local_50);
        (pcVar8->channel).securityToken.createdAt = tv.tv_sec / 100 + (long)local_50 * 10000000;
        if ((pcVar8->channel).connection == (UA_Connection *)0x0) {
          (pcVar8->channel).connection = conn;
          conn->channel = (UA_SecureChannel *)pcVar8;
        }
        pcVar3 = (cm->channels).lh_first;
        (pcVar8->pointers).le_next = pcVar3;
        if (pcVar3 != (channel_list_entry *)0x0) {
          (pcVar3->pointers).le_prev = &(pcVar8->pointers).le_next;
        }
        (cm->channels).lh_first = pcVar8;
        (pcVar8->pointers).le_prev = (channel_list_entry **)cm;
        cm->currentChannelCount = cm->currentChannelCount + 1;
        UVar7 = 0;
      }
    }
    else {
      UVar7 = 0x80030000;
      for (pcVar8 = (cm->channels).lh_first; pcVar8 != (channel_list_entry *)0x0;
          pcVar8 = (pcVar8->pointers).le_next) {
        if ((pcVar8->channel).sessions.lh_first == (SessionEntry *)0x0) {
          removeSecureChannel(cm,pcVar8);
          if (pcVar8 == (cm->channels).lh_first) {
            __assert_fail("entry != ((&cm->channels)->lh_first)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                          ,0x48bd,
                          "UA_Boolean purgeFirstChannelWithoutSession(UA_SecureChannelManager *)");
          }
          goto LAB_0011c2ad;
        }
      }
    }
  }
  return UVar7;
}

Assistant:

UA_StatusCode
UA_SecureChannelManager_open(UA_SecureChannelManager *cm, UA_Connection *conn,
                             const UA_OpenSecureChannelRequest *request,
                             UA_OpenSecureChannelResponse *response) {
    if(request->securityMode != UA_MESSAGESECURITYMODE_NONE)
        return UA_STATUSCODE_BADSECURITYMODEREJECTED;

    //check if there exists a free SC, otherwise try to purge one SC without a session
    //the purge has been introduced to pass CTT, it is not clear what strategy is expected here
    if(cm->currentChannelCount >= cm->server->config.maxSecureChannels && !purgeFirstChannelWithoutSession(cm)){
        return UA_STATUSCODE_BADOUTOFMEMORY;
    }

    /* Set up the channel */
    channel_list_entry *entry = UA_malloc(sizeof(channel_list_entry));
    if(!entry)
        return UA_STATUSCODE_BADOUTOFMEMORY;
    UA_SecureChannel_init(&entry->channel);
    entry->channel.securityToken.channelId = cm->lastChannelId++;
    entry->channel.securityToken.tokenId = cm->lastTokenId++;
    entry->channel.securityToken.createdAt = UA_DateTime_now();
    entry->channel.securityToken.revisedLifetime =
        (request->requestedLifetime > cm->server->config.maxSecurityTokenLifetime) ?
        cm->server->config.maxSecurityTokenLifetime : request->requestedLifetime;
    if(entry->channel.securityToken.revisedLifetime == 0) /* lifetime 0 -> set the maximum possible */
        entry->channel.securityToken.revisedLifetime = cm->server->config.maxSecurityTokenLifetime;
    UA_ByteString_copy(&request->clientNonce, &entry->channel.clientNonce);
    entry->channel.serverAsymAlgSettings.securityPolicyUri =
        UA_STRING_ALLOC("http://opcfoundation.org/UA/SecurityPolicy#None");
    UA_SecureChannel_generateNonce(&entry->channel.serverNonce);

    /* Set the response */
    UA_ByteString_copy(&entry->channel.serverNonce, &response->serverNonce);
    UA_ChannelSecurityToken_copy(&entry->channel.securityToken, &response->securityToken);
    response->responseHeader.timestamp = UA_DateTime_now();

    /* Now overwrite the creation date with the internal monotonic clock */
    entry->channel.securityToken.createdAt = UA_DateTime_nowMonotonic();

    /* Set all the pointers internally */
    UA_Connection_attachSecureChannel(conn, &entry->channel);
    LIST_INSERT_HEAD(&cm->channels, entry, pointers);
    UA_atomic_add(&cm->currentChannelCount, 1);
    return UA_STATUSCODE_GOOD;
}